

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Load(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  char *format;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAbc->pGiaBest != (Gia_Man_t *)0x0) {
      Gia_ManStopP(&pAbc->pGia);
      pGVar2 = Gia_ManDupWithAttributes(pAbc->pGiaBest);
      pAbc->pGia = pGVar2;
      return 0;
    }
    format = "Abc_CommandAbc9Load(): There is no best design saved.\n";
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: &load [-h]\n");
    Abc_Print(-2,"\t        loads AIG with mapping previously saved by &save\n");
    Abc_Print(-2,"\t        (after loading the previously saved AIG can be loaded again)\n");
    format = "\t-h    : print the command usage\n";
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandAbc9Load( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    // restore from best
    if ( pAbc->pGiaBest == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Load(): There is no best design saved.\n" );
        return 1;
    }
    Gia_ManStopP( &pAbc->pGia );
    pAbc->pGia = Gia_ManDupWithAttributes( pAbc->pGiaBest );
    return 0;

usage:
    Abc_Print( -2, "usage: &load [-h]\n" );
    Abc_Print( -2, "\t        loads AIG with mapping previously saved by &save\n" );
    Abc_Print( -2, "\t        (after loading the previously saved AIG can be loaded again)\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}